

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InterpolateAtSampleRenderCase::
genFragmentSource_abi_cxx11_(string *__return_storage_ptr__,void *this,int numTargetSamples)

{
  ulong uVar1;
  ostream *poVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  ostringstream buf;
  ContextType local_1cc;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "${GLSL_VERSION_DECL}\n${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}",0x41);
  uVar1 = (ulong)*(uint *)((long)this + 0xbc);
  if (uVar1 < 5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,&DAT_0095e258 + *(int *)(&DAT_0095e258 + uVar1 * 4),
               *(long *)(&DAT_0095e270 + uVar1 * 8));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out mediump vec4 fragColor;\n",0x31);
  if (*(int *)((long)this + 0x128) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"uniform highp int u_offset;\nuniform highp int u_range;\n",0x37
              );
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"void main (void)\n{\n\tmediump int coverage = 0;\n\n",0x2f);
  if (*(int *)((long)this + 0x128) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tfor (int ndx = 0; ndx < ",0x19);
    poVar2 = (ostream *)std::ostream::operator<<(local_1a8,numTargetSamples);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"; ++ndx)\n\t{\n",0xc);
    uVar1 = (ulong)*(uint *)((long)this + 0xbc);
    if (uVar1 < 5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,&DAT_0095e298 + *(int *)(&DAT_0095e298 + uVar1 * 4),
                 *(long *)(&DAT_0095e2b0 + uVar1 * 8));
      uVar1 = (ulong)*(uint *)((long)this + 0xbc);
    }
    if ((uint)uVar1 < 5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,&DAT_0095e2d8 + *(int *)(&DAT_0095e2d8 + uVar1 * 4),
                 *(long *)(&DAT_0095e2f0 + uVar1 * 8));
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\t\tif (fract(field) <= 0.5)\n\t\t\t++coverage;\n\t}\n",0x2d);
  }
  else if (*(int *)((long)this + 0x128) == 0) {
    if (0 < numTargetSamples) {
      iVar4 = 0;
      do {
        switch(*(undefined4 *)((long)this + 0xbc)) {
        case 0:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\thighp float sampleInput",0x18);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2," = interpolateAtSample(v_input, ",0x20);
          break;
        case 1:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\thighp vec2 sampleInput",0x17);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2," = interpolateAtSample(v_input, ",0x20);
          break;
        case 2:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\thighp vec3 sampleInput",0x17);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2," = interpolateAtSample(v_input, ",0x20);
          break;
        case 3:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\thighp vec4 sampleInput",0x17);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2," = interpolateAtSample(v_input, ",0x20);
          break;
        case 4:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\thighp vec2 sampleInput",0x17);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2," = interpolateAtSample(v_input[1], ",0x23);
          break;
        default:
          goto switchD_00411c29_default;
        }
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,");\n",3);
switchD_00411c29_default:
        iVar4 = iVar4 + 1;
      } while (numTargetSamples != iVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if (0 < numTargetSamples) {
      iVar4 = 0;
      do {
        switch(*(undefined4 *)((long)this + 0xbc)) {
        case 0:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\thighp float field",0x12);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," = exp(sampleInput",0x12);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,") + sampleInput",0xf);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"*sampleInput",0xc);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
          lVar3 = 2;
          pcVar5 = ";\n";
          break;
        case 1:
        case 4:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\thighp float field",0x12);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," = dot(sampleInput",0x12);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,", sampleInput",0xd);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,") + dot(21.0 * sampleInput",0x1a);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,".xx, sin(3.1 * sampleInput",0x1a);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
          lVar3 = 4;
          pcVar5 = "));\n";
          break;
        case 2:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\thighp float field",0x12);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," = dot(sampleInput",0x12);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,".xy, sampleInput",0x10);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,".xy) + dot(21.0 * sampleInput",0x1d);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,".zx, sin(3.1 * sampleInput",0x1a);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
          lVar3 = 7;
          pcVar5 = ".zy));\n";
          break;
        case 3:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\thighp float field",0x12);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," = dot(sampleInput",0x12);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,".xy, sampleInput",0x10);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,".zw) + dot(21.0 * sampleInput",0x1d);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,".zy, sin(3.1 * sampleInput",0x1a);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
          lVar3 = 7;
          pcVar5 = ".zw));\n";
          break;
        default:
          goto switchD_00411daf_default;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,lVar3);
switchD_00411daf_default:
        iVar4 = iVar4 + 1;
      } while (numTargetSamples != iVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if (0 < numTargetSamples) {
      iVar4 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"\tif (fract(field",0x10);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,") <= 0.5)\n\t\t++coverage;\n",0x18);
        iVar4 = iVar4 + 1;
      } while (numTargetSamples != iVar4);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tfragColor = vec4(vec3(float(coverage) / float(",0x2f);
  poVar2 = (ostream *)std::ostream::operator<<(local_1a8,numTargetSamples);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")), 1.0);\n}",0xb);
  std::__cxx11::stringbuf::str();
  local_1cc.super_ApiType.m_bits =
       (ApiType)(**(code **)(**(long **)(*(long *)((long)this + 0x70) + 8) + 0x10))();
  anon_unknown_2::specializeShader(__return_storage_ptr__,&local_1c8,&local_1cc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string InterpolateAtSampleRenderCase::genFragmentSource (int numTargetSamples) const
{
	std::ostringstream buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}";

	if (m_iteration == 0)
		buf << "in highp float v_input;\n";
	else if (m_iteration == 1)
		buf << "in highp vec2 v_input;\n";
	else if (m_iteration == 2)
		buf << "in highp vec3 v_input;\n";
	else if (m_iteration == 3)
		buf << "in highp vec4 v_input;\n";
	else if (m_iteration == 4)
		buf << "in highp vec2[2] v_input;\n";
	else
		DE_ASSERT(false);

	buf << "layout(location = 0) out mediump vec4 fragColor;\n";

	if (m_indexMode == INDEXING_DYNAMIC)
		buf <<	"uniform highp int u_offset;\n"
				"uniform highp int u_range;\n";

	buf <<	"void main (void)\n"
			"{\n"
			"	mediump int coverage = 0;\n"
			"\n";

	if (m_indexMode == INDEXING_STATIC)
	{
		for (int ndx = 0; ndx < numTargetSamples; ++ndx)
		{
			if (m_iteration == 0)
				buf <<	"	highp float sampleInput" << ndx << " = interpolateAtSample(v_input, " << ndx << ");\n";
			else if (m_iteration == 1)
				buf <<	"	highp vec2 sampleInput" << ndx << " = interpolateAtSample(v_input, " << ndx << ");\n";
			else if (m_iteration == 2)
				buf <<	"	highp vec3 sampleInput" << ndx << " = interpolateAtSample(v_input, " << ndx << ");\n";
			else if (m_iteration == 3)
				buf <<	"	highp vec4 sampleInput" << ndx << " = interpolateAtSample(v_input, " << ndx << ");\n";
			else if (m_iteration == 4)
				buf <<	"	highp vec2 sampleInput" << ndx << " = interpolateAtSample(v_input[1], " << ndx << ");\n";
			else
				DE_ASSERT(false);
		}
		buf <<	"\n";

		for (int ndx = 0; ndx < numTargetSamples; ++ndx)
		{
			if (m_iteration == 0)
				buf << "	highp float field" << ndx << " = exp(sampleInput" << ndx << ") + sampleInput" << ndx << "*sampleInput" << ndx << ";\n";
			else if (m_iteration == 1 || m_iteration == 4)
				buf << "	highp float field" << ndx << " = dot(sampleInput" << ndx << ", sampleInput" << ndx << ") + dot(21.0 * sampleInput" << ndx << ".xx, sin(3.1 * sampleInput" << ndx << "));\n";
			else if (m_iteration == 2)
				buf << "	highp float field" << ndx << " = dot(sampleInput" << ndx << ".xy, sampleInput" << ndx << ".xy) + dot(21.0 * sampleInput" << ndx << ".zx, sin(3.1 * sampleInput" << ndx << ".zy));\n";
			else if (m_iteration == 3)
				buf << "	highp float field" << ndx << " = dot(sampleInput" << ndx << ".xy, sampleInput" << ndx << ".zw) + dot(21.0 * sampleInput" << ndx << ".zy, sin(3.1 * sampleInput" << ndx << ".zw));\n";
			else
				DE_ASSERT(false);
		}
		buf <<	"\n";

		for (int ndx = 0; ndx < numTargetSamples; ++ndx)
			buf <<	"	if (fract(field" << ndx << ") <= 0.5)\n"
					"		++coverage;\n";
	}
	else if (m_indexMode == INDEXING_DYNAMIC)
	{
		buf <<	"	for (int ndx = 0; ndx < " << numTargetSamples << "; ++ndx)\n"
				"	{\n";

		if (m_iteration == 0)
			buf <<	"		highp float sampleInput = interpolateAtSample(v_input, (u_offset + ndx) % u_range);\n";
		else if (m_iteration == 1)
			buf <<	"		highp vec2 sampleInput = interpolateAtSample(v_input, (u_offset + ndx) % u_range);\n";
		else if (m_iteration == 2)
			buf <<	"		highp vec3 sampleInput = interpolateAtSample(v_input, (u_offset + ndx) % u_range);\n";
		else if (m_iteration == 3)
			buf <<	"		highp vec4 sampleInput = interpolateAtSample(v_input, (u_offset + ndx) % u_range);\n";
		else if (m_iteration == 4)
			buf <<	"		highp vec2 sampleInput = interpolateAtSample(v_input[1], (u_offset + ndx) % u_range);\n";
		else
			DE_ASSERT(false);

		if (m_iteration == 0)
			buf << "		highp float field = exp(sampleInput) + sampleInput*sampleInput;\n";
		else if (m_iteration == 1 || m_iteration == 4)
			buf << "		highp float field = dot(sampleInput, sampleInput) + dot(21.0 * sampleInput.xx, sin(3.1 * sampleInput));\n";
		else if (m_iteration == 2)
			buf << "		highp float field = dot(sampleInput.xy, sampleInput.xy) + dot(21.0 * sampleInput.zx, sin(3.1 * sampleInput.zy));\n";
		else if (m_iteration == 3)
			buf << "		highp float field = dot(sampleInput.xy, sampleInput.zw) + dot(21.0 * sampleInput.zy, sin(3.1 * sampleInput.zw));\n";
		else
			DE_ASSERT(false);

		buf <<	"		if (fract(field) <= 0.5)\n"
				"			++coverage;\n"
				"	}\n";
	}

	buf <<	"	fragColor = vec4(vec3(float(coverage) / float(" << numTargetSamples << ")), 1.0);\n"
			"}";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}